

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::DOMNodeImpl::getTextContent
          (DOMNodeImpl *this,XMLCh *pzBuffer,XMLSize_t *rnBufferLength)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  XMLSize_t in_RAX;
  undefined4 extraout_var;
  XMLSize_t maxChars;
  DOMNode *p;
  DOMNodeImpl *pDVar4;
  long lVar5;
  ulong uVar6;
  XMLSize_t nContentLength;
  
  uVar6 = *rnBufferLength;
  *rnBufferLength = 0;
  if (pzBuffer != (XMLCh *)0x0) {
    *pzBuffer = L'\0';
  }
  p = this->fContainingNode;
  nContentLength = in_RAX;
  uVar2 = (*p->_vptr_DOMNode[4])(p);
  if (uVar2 < 0xc) {
    if ((0x19cU >> (uVar2 & 0x1f) & 1) == 0) {
      if ((0x862U >> (uVar2 & 0x1f) & 1) != 0) {
        lVar1 = 0x50;
        lVar5 = 0x38;
        while( true ) {
          p = (DOMNode *)(**(code **)((long)p->_vptr_DOMNode + lVar5))(p);
          if (p == (DOMNode *)0x0) break;
          iVar3 = (*p->_vptr_DOMNode[4])(p);
          lVar5 = lVar1;
          if (iVar3 != 8) {
            iVar3 = (*p->_vptr_DOMNode[4])(p);
            if (iVar3 != 7) {
              if (pzBuffer == (XMLCh *)0x0) {
                nContentLength = 0;
                pDVar4 = castToNodeImpl(p);
                getTextContent(pDVar4,(XMLCh *)0x0,&nContentLength);
                *rnBufferLength = *rnBufferLength + nContentLength;
              }
              else {
                nContentLength = uVar6;
                pDVar4 = castToNodeImpl(p);
                getTextContent(pDVar4,pzBuffer + *rnBufferLength,&nContentLength);
                *rnBufferLength = *rnBufferLength + nContentLength;
                uVar6 = uVar6 - nContentLength;
              }
            }
          }
        }
      }
    }
    else {
      iVar3 = (*p->_vptr_DOMNode[3])(p);
      maxChars = XMLString::stringLen((XMLCh *)CONCAT44(extraout_var,iVar3));
      if (pzBuffer != (XMLCh *)0x0) {
        if (uVar6 < maxChars) {
          maxChars = uVar6;
        }
        XMLString::copyNString
                  (pzBuffer + *rnBufferLength,(XMLCh *)CONCAT44(extraout_var,iVar3),maxChars);
      }
      *rnBufferLength = *rnBufferLength + maxChars;
    }
  }
  return pzBuffer;
}

Assistant:

const XMLCh*    DOMNodeImpl::getTextContent(XMLCh* pzBuffer, XMLSize_t& rnBufferLength) const
{
	XMLSize_t nRemainingBuffer = rnBufferLength;
	rnBufferLength = 0;

	if (pzBuffer)
		*pzBuffer = 0;

	const DOMNode *thisNode = getContainingNode();

	switch (thisNode->getNodeType())
	{
	case DOMNode::ELEMENT_NODE:
    case DOMNode::ENTITY_NODE:
    case DOMNode::ENTITY_REFERENCE_NODE:
    case DOMNode::DOCUMENT_FRAGMENT_NODE:
    {
		DOMNode* current = thisNode->getFirstChild();

		while (current != NULL)
		{
			if (current->getNodeType() != DOMNode::COMMENT_NODE &&
				current->getNodeType() != DOMNode::PROCESSING_INSTRUCTION_NODE)
			{

				if (pzBuffer)
				{
					XMLSize_t nContentLength = nRemainingBuffer;
					castToNodeImpl(current)->getTextContent(pzBuffer + rnBufferLength, nContentLength);
					rnBufferLength += nContentLength;
					nRemainingBuffer -= nContentLength;
				}
				else
				{
					XMLSize_t nContentLength = 0;
					castToNodeImpl(current)->getTextContent(NULL, nContentLength);
					rnBufferLength += nContentLength;
				}
			}

			current = current->getNextSibling();

		}
    }

    break;

    case DOMNode::ATTRIBUTE_NODE:
    case DOMNode::TEXT_NODE:
    case DOMNode::CDATA_SECTION_NODE:
    case DOMNode::COMMENT_NODE:
    case DOMNode::PROCESSING_INSTRUCTION_NODE:
    {
		const XMLCh* pzValue = thisNode->getNodeValue();
		XMLSize_t nStrLen = XMLString::stringLen(pzValue);

		if (pzBuffer)
		{
			XMLSize_t nContentLength = (nRemainingBuffer >= nStrLen) ? nStrLen : nRemainingBuffer;
			XMLString::copyNString(pzBuffer + rnBufferLength, pzValue, nContentLength);
			rnBufferLength += nContentLength;
			nRemainingBuffer -= nContentLength;
		}
		else
		{
			rnBufferLength += nStrLen;
		}

    }

    break;

	/***
         DOCUMENT_NODE
		 DOCUMENT_TYPE_NODE
		 NOTATION_NODE
	***/
	default:

		break;
	}

	return pzBuffer;

}